

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5Array::SetPropertyWithAttributes
          (ES5Array *this,PropertyId propertyId,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  DynamicTypeHandler *pDVar7;
  
  if (propertyId != 0xd1) {
    BVar5 = JavascriptArray::SetPropertyWithAttributes
                      (&this->super_JavascriptArray,propertyId,value,attributes,info,flags,
                       possibleSideEffects);
    return BVar5;
  }
  if (attributes != '\x04') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ES5Array.cpp"
                                ,0xe9,"(attributes == 0x04)","attributes == PropertyWritable");
    if (!bVar2) goto LAB_00a1b1bf;
    *puVar6 = 0;
  }
  iVar3 = (*(this->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x30])(this,0xd1);
  if (iVar3 != 0) {
    iVar3 = (*(this->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x31])(this,0xd1);
    if (iVar3 == 0) {
      iVar3 = (*(this->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x32])(this,0xd1);
      if (iVar3 == 0) goto LAB_00a1b162;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar6 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ES5Array.cpp"
                              ,0xea,
                              "(IsWritable(propertyId) && !IsConfigurable(propertyId) && !IsEnumerable(propertyId))"
                              ,
                              "IsWritable(propertyId) && !IsConfigurable(propertyId) && !IsEnumerable(propertyId)"
                             );
  if (!bVar2) {
LAB_00a1b1bf:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar6 = 0;
LAB_00a1b162:
  uVar4 = ToLengthValue(value,(((((this->super_JavascriptArray).super_ArrayObject.
                                  super_DynamicObject.super_RecyclableObject.type.ptr)->
                                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                              ptr);
  pDVar7 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  (*pDVar7->_vptr_DynamicTypeHandler[0x42])(pDVar7,this,(ulong)uVar4,0);
  return 1;
}

Assistant:

BOOL ES5Array::SetPropertyWithAttributes(PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        if (propertyId == PropertyIds::length)
        {
            Assert(attributes == PropertyWritable);
            Assert(IsWritable(propertyId) && !IsConfigurable(propertyId) && !IsEnumerable(propertyId));

            uint32 newLen = ToLengthValue(value, GetScriptContext());
            GetTypeHandler()->SetLength(this, newLen, PropertyOperation_None);
            return true;
        }

        return __super::SetPropertyWithAttributes(propertyId, value, attributes, info, flags, possibleSideEffects);
    }